

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Image(ImTextureID user_texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,ImVec4 *tint_col,
                 ImVec4 *border_col)

{
  bool bVar1;
  ImVec2 *in_RCX;
  ImDrawVert *in_RDX;
  ImDrawListSharedData *in_R9;
  ImRect bb;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  ImRect *in_stack_ffffffffffffff00;
  ImVec4 *in_stack_ffffffffffffff10;
  ImRect *in_stack_ffffffffffffff18;
  ImVec2 *pIVar2;
  ImVec2 *in_stack_ffffffffffffff20;
  ImRect *in_stack_ffffffffffffff28;
  ImVec2 *in_stack_ffffffffffffff30;
  ImDrawList *p_min;
  ImTextureID in_stack_ffffffffffffff38;
  undefined1 *user_texture_id_00;
  ImDrawList *in_stack_ffffffffffffff40;
  ImDrawList *this;
  ImU32 in_stack_ffffffffffffff50;
  ImU32 col;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  ImVec2 *in_stack_ffffffffffffff90;
  ImVec2 *in_stack_ffffffffffffff98;
  ImDrawList *in_stack_ffffffffffffffa0;
  ImVec2 local_50;
  undefined1 local_48 [16];
  ImGuiWindow *local_38;
  ImDrawListSharedData *local_30;
  ImVec2 *local_20;
  ImDrawVert *local_18;
  
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_38 = GetCurrentWindow();
  if ((local_38->SkipItems & 1U) == 0) {
    pIVar2 = &(local_38->DC).CursorPos;
    local_50 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                           (ImVec2 *)0x232aae);
    ImRect::ImRect((ImRect *)local_48,pIVar2,&local_50);
    if (0.0 < *(float *)((long)&local_30->Font + 4)) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa8,2.0,2.0);
      operator+=((ImVec2 *)(local_48 + 8),(ImVec2 *)&stack0xffffffffffffffa8);
    }
    ItemSize(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    bVar1 = ItemAdd(in_stack_ffffffffffffff28,(ImGuiID)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                    in_stack_ffffffffffffff18);
    if (bVar1) {
      if (*(float *)((long)&local_30->Font + 4) <= 0.0) {
        pIVar2 = (ImVec2 *)(local_48 + 8);
        GetColorU32((ImVec4 *)local_48);
        ImDrawList::AddImage
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                   local_20,&local_18->pos,pIVar2,in_stack_ffffffffffffff50);
      }
      else {
        p_min = local_38->DrawList;
        col = (int)local_48 + 8;
        GetColorU32(in_stack_ffffffffffffff10);
        user_texture_id_00 = local_48;
        ImDrawList::AddRect(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                            in_stack_ffffffffffffff90,(ImU32)in_stack_ffffffffffffff8c,
                            in_stack_ffffffffffffff88,(ImDrawCornerFlags)((ulong)pIVar2 >> 0x20),
                            SUB84(pIVar2,0));
        this = (ImDrawList *)&stack0xffffffffffffff98;
        ImVec2::ImVec2((ImVec2 *)this,1.0,1.0);
        ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                    (ImVec2 *)0x232c12);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,1.0,1.0);
        ::operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                    (ImVec2 *)0x232c45);
        GetColorU32(in_stack_ffffffffffffff10);
        ImDrawList::AddImage
                  (this,user_texture_id_00,(ImVec2 *)p_min,&in_stack_ffffffffffffff28->Min,
                   in_stack_ffffffffffffff20,&in_stack_ffffffffffffff18->Min,col);
      }
    }
  }
  return;
}

Assistant:

void ImGui::Image(ImTextureID user_texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, const ImVec4& tint_col, const ImVec4& border_col)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    if (border_col.w > 0.0f)
        bb.Max += ImVec2(2, 2);
    ItemSize(bb);
    if (!ItemAdd(bb, 0))
        return;

    if (border_col.w > 0.0f)
    {
        window->DrawList->AddRect(bb.Min, bb.Max, GetColorU32(border_col), 0.0f);
        window->DrawList->AddImage(user_texture_id, bb.Min + ImVec2(1, 1), bb.Max - ImVec2(1, 1), uv0, uv1, GetColorU32(tint_col));
    }
    else
    {
        window->DrawList->AddImage(user_texture_id, bb.Min, bb.Max, uv0, uv1, GetColorU32(tint_col));
    }
}